

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_string_vector(exr_context_t ctxt,exr_attribute_t *a)

{
  bool bVar1;
  int *sz;
  long in_RSI;
  long in_RDI;
  exr_attr_string_t *s;
  int i_1;
  int i;
  size_t attrsz;
  exr_result_t rv;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  int iVar3;
  int local_14;
  
  for (iVar3 = 0; iVar3 < **(int **)(in_RSI + 0x18); iVar3 = iVar3 + 1) {
  }
  local_14 = save_attr_sz((exr_context_t)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd0);
  iVar2 = 0;
  while( true ) {
    bVar1 = false;
    if (local_14 == 0) {
      bVar1 = iVar2 < **(int **)(in_RSI + 0x18);
    }
    if (!bVar1) break;
    sz = (int *)(*(long *)(*(long *)(in_RSI + 0x18) + 8) + (long)iVar2 * 0x10);
    local_14 = save_attr_sz((exr_context_t)CONCAT44(iVar3,iVar2),(size_t)sz);
    if (local_14 == 0) {
      local_14 = (**(code **)(in_RDI + 0x30))
                           (in_RDI,*(undefined8 *)(sz + 2),(long)*sz,in_RDI + 0xb0);
    }
    iVar2 = iVar2 + 1;
  }
  return local_14;
}

Assistant:

static exr_result_t
save_string_vector (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    size_t       attrsz = 0;

    for (int i = 0; i < a->stringvector->n_strings; ++i)
    {
        attrsz += sizeof (int32_t);
        attrsz += (size_t) a->stringvector->strings[i].length;
    }

    rv = save_attr_sz (ctxt, attrsz);

    for (int i = 0; rv == EXR_ERR_SUCCESS && i < a->stringvector->n_strings;
         ++i)
    {
        const exr_attr_string_t* s = a->stringvector->strings + i;

        rv = save_attr_sz (ctxt, (size_t) s->length);
        if (rv == EXR_ERR_SUCCESS)
            rv = ctxt->do_write (
                ctxt,
                s->str,
                (uint64_t) s->length,
                &(ctxt->output_file_offset));
    }

    return rv;
}